

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  bool bVar2;
  Layer *pLVar3;
  int *piVar4;
  const_reference ppLVar5;
  char *pcVar6;
  float *pfVar7;
  undefined8 *in_RCX;
  long in_RDX;
  Mat *in_RSI;
  long in_RDI;
  double dVar8;
  float max;
  float min;
  float slope;
  float w_3;
  float val_2;
  int k_2;
  float *sptr_2;
  Mat m_2;
  int q_2;
  float *kptr_2;
  float sum_2;
  int j_3;
  int i_5;
  float *outptr_2;
  int p_2;
  int i_4;
  float *outptr_fp32;
  Mat top_blob_g_1;
  Option opt_g_2;
  int w_2;
  int val_1;
  int k_1;
  char *sptr_1;
  Mat m_1;
  int q_1;
  char *kptr_1;
  int sum_1;
  int j_2;
  int i_3;
  int *outptr_1;
  int p_1;
  int i_2;
  char *outptr_s8;
  Mat top_blob_g;
  Mat top_blob_tm_g;
  Option opt_g_1;
  int w_1;
  int val;
  int k;
  char *sptr;
  Mat m;
  int q;
  char *kptr;
  int sum;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  Mat top_blob_tm;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Option opt_b_2;
  int hpad_1;
  int wpad_1;
  Option opt_b_1;
  int hpad;
  int wpad;
  Option opt_b;
  Mat bottom_blob_bordered;
  Option opt_g;
  Mat bottom_blob_int8;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat weights [4];
  ParamDict pd;
  Layer *op;
  int num_input;
  undefined4 in_stack_ffffffffffffedb8;
  undefined4 in_stack_ffffffffffffedbc;
  Mat *in_stack_ffffffffffffedc0;
  undefined4 in_stack_ffffffffffffedc8;
  float in_stack_ffffffffffffedcc;
  allocator_type *in_stack_ffffffffffffedd0;
  int _c;
  Mat *in_stack_ffffffffffffedd8;
  int _w;
  undefined4 in_stack_ffffffffffffede0;
  undefined4 in_stack_ffffffffffffede4;
  ParamDict *in_stack_ffffffffffffee00;
  Mat *local_1138;
  Mat *local_10f8;
  float local_10d0;
  float local_10cc;
  float local_10c8;
  int local_10c4;
  float *local_10c0;
  Mat local_10b8;
  int local_1074;
  float *local_1070;
  float local_1064;
  int local_1060;
  int local_105c;
  Mat local_1058;
  float *local_1018;
  int local_100c;
  float local_1008;
  int local_1004;
  Mat local_1000;
  float *local_fc0;
  undefined1 local_fb8 [64];
  undefined4 local_f78;
  undefined4 uStack_f74;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  int local_f44;
  int local_f40;
  int local_f3c;
  char *local_f38;
  Mat local_f30;
  int local_eec;
  char *local_ee8;
  int local_edc;
  int local_ed8;
  int local_ed4;
  Mat local_ed0;
  int *local_e90;
  int local_e88;
  int local_e84;
  Mat local_e80;
  char *local_e40;
  undefined1 local_e38 [64];
  undefined1 local_df8 [64];
  undefined4 local_db8;
  undefined4 uStack_db4;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  int local_d8c;
  int local_d88;
  int local_d84;
  char *local_d80;
  Mat local_d78;
  int local_d34;
  char *local_d30;
  int local_d24;
  int local_d20;
  int local_d1c;
  Mat local_d18;
  int *local_cd8;
  int local_ccc;
  Mat local_cc8;
  int local_c84;
  int local_c80;
  int local_c7c;
  int local_c78;
  int local_c74;
  reference local_c70;
  vector<int,_std::allocator<int>_> local_c60;
  int local_c44;
  int local_c40;
  int local_c3c;
  undefined1 local_c38 [48];
  undefined1 local_c08 [48];
  undefined1 local_bd8 [92];
  int local_b7c;
  int local_b78;
  undefined8 local_b68;
  Allocator *pAStack_b60;
  undefined4 local_b58;
  undefined4 uStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined8 local_b48;
  uint local_b3c;
  Mat local_b38;
  Mat local_af8;
  int local_ab8;
  int local_ab4;
  size_t local_ab0;
  int local_aa4;
  int local_aa0;
  int local_a9c;
  undefined1 local_a98 [16];
  Mat local_a88;
  Mat local_a48 [4];
  undefined1 local_938 [28];
  float in_stack_fffffffffffff6e4;
  int in_stack_fffffffffffff6e8;
  int in_stack_fffffffffffff6ec;
  int in_stack_fffffffffffff6f0;
  int in_stack_fffffffffffff6f4;
  Mat *in_stack_fffffffffffff6f8;
  Mat *in_stack_fffffffffffff700;
  int in_stack_fffffffffffff710;
  Option *in_stack_fffffffffffff718;
  int local_4;
  
  if ((((in_RSI->dims == 1) && (*(int *)(in_RDI + 0x84) == 1)) && (*(int *)(in_RDI + 0x88) == 1)) &&
     (in_RSI->w == *(int *)(in_RDI + 0xb4) / *(int *)(in_RDI + 0x80))) {
    pLVar3 = create_layer((int)in_stack_ffffffffffffedcc);
    ParamDict::ParamDict(in_stack_ffffffffffffee00);
    ParamDict::set((ParamDict *)local_938,0,*(int *)(in_RDI + 0x80));
    ParamDict::set((ParamDict *)local_938,1,*(int *)(in_RDI + 0xb0));
    ParamDict::set((ParamDict *)local_938,2,*(int *)(in_RDI + 0xb4));
    ParamDict::set((ParamDict *)local_938,8,*(int *)(in_RDI + 0xb8));
    (*pLVar3->_vptr_Layer[2])(pLVar3,local_938);
    local_10f8 = local_a48;
    do {
      Mat::Mat(local_10f8);
      local_10f8 = local_10f8 + 1;
    } while (local_10f8 != (Mat *)&stack0xfffffffffffff6b8);
    Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                   in_stack_ffffffffffffedc0);
    Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                   in_stack_ffffffffffffedc0);
    if (*(int *)(in_RDI + 0xb8) != 0) {
      Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                     in_stack_ffffffffffffedc0);
      Mat::Mat(&local_a88,1,4,(void *)(in_RDI + 0x1c0),4,(Allocator *)0x0);
      Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                     in_stack_ffffffffffffedc0);
      Mat::~Mat((Mat *)0x149b76);
    }
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)in_stack_ffffffffffffedc0,
               (Mat *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8));
    (*pLVar3->_vptr_Layer[3])(pLVar3,local_a98);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x149c8c);
    (*pLVar3->_vptr_Layer[4])(pLVar3,in_RCX);
    (*pLVar3->_vptr_Layer[7])(pLVar3,in_RSI,in_RDX,in_RCX);
    if (pLVar3 != (Layer *)0x0) {
      (*pLVar3->_vptr_Layer[1])();
    }
    local_1138 = (Mat *)&stack0xfffffffffffff6b8;
    do {
      local_1138 = local_1138 + -1;
      Mat::~Mat((Mat *)0x149d5d);
    } while (local_1138 != local_a48);
    ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffedd0);
    return 0;
  }
  local_a9c = in_RSI->w;
  local_aa0 = in_RSI->h;
  local_aa4 = in_RSI->c;
  local_ab0 = in_RSI->elemsize;
  local_ab4 = *(int *)(in_RDI + 0x8c) * (*(int *)(in_RDI + 0x84) + -1) + 1;
  local_ab8 = *(int *)(in_RDI + 0x90) * (*(int *)(in_RDI + 0x88) + -1) + 1;
  Mat::Mat(&local_af8,in_RSI);
  if (((*(byte *)(in_RDI + 0x1c8) & 1) != 0) && (local_ab0 != 1)) {
    Mat::Mat(&local_b38);
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                (int)((ulong)in_stack_ffffffffffffedd8 >> 0x20),(int)in_stack_ffffffffffffedd8,
                (int)((ulong)in_stack_ffffffffffffedd0 >> 0x20),
                CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                (Allocator *)in_stack_ffffffffffffedc0);
    bVar2 = Mat::empty(in_stack_ffffffffffffedc0);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      local_b48 = in_RCX[4];
      local_b68 = *in_RCX;
      local_b58 = *(undefined4 *)(in_RCX + 2);
      uStack_b54 = *(undefined4 *)((long)in_RCX + 0x14);
      uStack_b50 = *(undefined4 *)(in_RCX + 3);
      uStack_b4c = *(undefined4 *)((long)in_RCX + 0x1c);
      pAStack_b60 = local_b38.allocator;
      (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x38))
                (*(long **)(in_RDI + 0x1d0),in_RSI,&local_b38,&local_b68);
      Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                     in_stack_ffffffffffffedc0);
    }
    local_b3c = (uint)bVar2;
    Mat::~Mat((Mat *)0x14a017);
    if (local_b3c != 0) goto LAB_0014ba51;
  }
  Mat::Mat((Mat *)(local_bd8 + 0x30),&local_af8);
  if (((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) &&
     ((*(int *)(in_RDI + 0xa4) < 1 && (*(int *)(in_RDI + 0xa8) < 1)))) {
    if ((((*(int *)(in_RDI + 0x9c) == -0xe9) && (*(int *)(in_RDI + 0xa0) == -0xe9)) &&
        (*(int *)(in_RDI + 0xa4) == -0xe9)) && (*(int *)(in_RDI + 0xa8) == -0xe9)) {
      local_c08._44_4_ =
           (local_ab4 + ((local_a9c + -1) / *(int *)(in_RDI + 0x94)) * *(int *)(in_RDI + 0x94)) -
           local_a9c;
      local_c08._40_4_ =
           (local_ab8 + ((local_aa0 + -1) / *(int *)(in_RDI + 0x98)) * *(int *)(in_RDI + 0x98)) -
           local_aa0;
      if ((0 < (int)local_c08._44_4_) || (0 < (int)local_c08._40_4_)) {
        local_c08._32_8_ = in_RCX[4];
        local_c08._0_8_ = *in_RCX;
        local_c08._16_4_ = *(undefined4 *)(in_RCX + 2);
        local_c08._20_4_ = *(undefined4 *)((long)in_RCX + 0x14);
        local_c08._24_4_ = *(undefined4 *)(in_RCX + 3);
        local_c08._28_4_ = *(undefined4 *)((long)in_RCX + 0x1c);
        local_c08._8_8_ = in_RCX[2];
        in_stack_ffffffffffffedc0 = (Mat *)local_c08;
        copy_make_border(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,
                         in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0,
                         in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8,
                         in_stack_fffffffffffff710,in_stack_fffffffffffff6e4,
                         in_stack_fffffffffffff718);
      }
    }
    else if (((*(int *)(in_RDI + 0x9c) == -0xea) && (*(int *)(in_RDI + 0xa0) == -0xea)) &&
            ((*(int *)(in_RDI + 0xa4) == -0xea && (*(int *)(in_RDI + 0xa8) == -0xea)))) {
      local_c38._44_4_ =
           (local_ab4 + ((local_a9c + -1) / *(int *)(in_RDI + 0x94)) * *(int *)(in_RDI + 0x94)) -
           local_a9c;
      local_c38._40_4_ =
           (local_ab8 + ((local_aa0 + -1) / *(int *)(in_RDI + 0x98)) * *(int *)(in_RDI + 0x98)) -
           local_aa0;
      if ((0 < (int)local_c38._44_4_) || (0 < (int)local_c38._40_4_)) {
        local_c38._32_8_ = in_RCX[4];
        local_c38._0_8_ = *in_RCX;
        local_c38._16_4_ = *(undefined4 *)(in_RCX + 2);
        local_c38._20_4_ = *(undefined4 *)((long)in_RCX + 0x14);
        local_c38._24_4_ = *(undefined4 *)(in_RCX + 3);
        local_c38._28_4_ = *(undefined4 *)((long)in_RCX + 0x1c);
        local_c38._8_8_ = in_RCX[2];
        in_stack_ffffffffffffedc0 = (Mat *)local_c38;
        copy_make_border(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,
                         in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0,
                         in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8,
                         in_stack_fffffffffffff710,in_stack_fffffffffffff6e4,
                         in_stack_fffffffffffff718);
      }
    }
  }
  else {
    local_bd8._32_8_ = in_RCX[4];
    local_bd8._0_8_ = *in_RCX;
    local_bd8._16_4_ = *(undefined4 *)(in_RCX + 2);
    local_bd8._20_4_ = *(undefined4 *)((long)in_RCX + 0x14);
    local_bd8._24_4_ = *(undefined4 *)(in_RCX + 3);
    local_bd8._28_4_ = *(undefined4 *)((long)in_RCX + 0x1c);
    local_bd8._8_8_ = in_RCX[2];
    in_stack_ffffffffffffedc0 = (Mat *)local_bd8;
    copy_make_border(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f4,
                     in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8,
                     in_stack_fffffffffffff710,in_stack_fffffffffffff6e4,in_stack_fffffffffffff718);
  }
  bVar2 = Mat::empty(in_stack_ffffffffffffedc0);
  if (bVar2) {
    local_4 = -100;
    local_b3c = 1;
  }
  else {
    local_a9c = local_b7c;
    local_aa0 = local_b78;
    local_c3c = (local_b7c - local_ab4) / *(int *)(in_RDI + 0x94) + 1;
    local_c40 = (local_b78 - local_ab8) / *(int *)(in_RDI + 0x98) + 1;
    local_c44 = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
    std::allocator<int>::allocator((allocator<int> *)0x14a58a);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
               (size_type)in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
    std::allocator<int>::~allocator((allocator<int> *)0x14a5b6);
    local_c70 = std::vector<int,_std::allocator<int>_>::operator[](&local_c60,0);
    local_c74 = 0;
    local_c78 = 0;
    local_c7c = local_a9c * *(int *)(in_RDI + 0x90) -
                *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x8c);
    for (local_c80 = 0; local_c80 < *(int *)(in_RDI + 0x88); local_c80 = local_c80 + 1) {
      for (local_c84 = 0; local_c84 < *(int *)(in_RDI + 0x84); local_c84 = local_c84 + 1) {
        local_c70[local_c74] = local_c78;
        local_c74 = local_c74 + 1;
        local_c78 = *(int *)(in_RDI + 0x8c) + local_c78;
      }
      local_c78 = local_c7c + local_c78;
    }
    _c = (int)((ulong)in_stack_ffffffffffffedd0 >> 0x20);
    _w = (int)((ulong)in_stack_ffffffffffffedd8 >> 0x20);
    if ((*(byte *)(in_RDI + 0x1c8) & 1) == 0) {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),_w,
                  (int)in_stack_ffffffffffffedd8,_c,
                  CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                  (Allocator *)in_stack_ffffffffffffedc0);
      bVar2 = Mat::empty(in_stack_ffffffffffffedc0);
      if (bVar2) {
        local_4 = -100;
        local_b3c = 1;
      }
      else {
        for (local_100c = 0; local_100c < *(int *)(in_RDI + 0x80); local_100c = local_100c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                       (int)((ulong)in_stack_ffffffffffffedc0 >> 0x20));
          pfVar7 = Mat::operator_cast_to_float_(&local_1058);
          Mat::~Mat((Mat *)0x14b4cc);
          local_1018 = pfVar7;
          for (local_105c = 0; local_105c < local_c40; local_105c = local_105c + 1) {
            for (local_1060 = 0; local_1060 < local_c3c; local_1060 = local_1060 + 1) {
              local_1064 = 0.0;
              if (*(int *)(in_RDI + 0xb0) != 0) {
                pfVar7 = Mat::operator[]((Mat *)(in_RDI + 0x140),local_100c);
                local_1064 = *pfVar7;
              }
              local_1070 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x100));
              local_1070 = local_1070 + local_c44 * local_aa4 * local_100c;
              for (local_1074 = 0; local_1074 < local_aa4; local_1074 = local_1074 + 1) {
                Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                             (int)((ulong)in_stack_ffffffffffffedc0 >> 0x20));
                local_10c0 = Mat::row(&local_10b8,local_105c * *(int *)(in_RDI + 0x98));
                local_10c0 = local_10c0 + local_1060 * *(int *)(in_RDI + 0x94);
                for (local_10c4 = 0; local_10c4 < local_c44; local_10c4 = local_10c4 + 1) {
                  local_10c8 = local_10c0[local_c70[local_10c4]];
                  local_10cc = local_1070[local_10c4];
                  local_1064 = local_10c8 * local_10cc + local_1064;
                }
                local_1070 = local_1070 + local_c44;
                Mat::~Mat((Mat *)0x14b764);
              }
              if (*(int *)(in_RDI + 0xbc) == 1) {
                local_10d0 = 0.0;
                pfVar7 = std::max<float>(&local_1064,&local_10d0);
                local_1064 = *pfVar7;
              }
              else if (*(int *)(in_RDI + 0xbc) == 2) {
                pfVar7 = Mat::operator[]((Mat *)(in_RDI + 0xc0),0);
                if (local_1064 <= 0.0) {
                  local_1064 = local_1064 * *pfVar7;
                }
              }
              else if (*(int *)(in_RDI + 0xbc) == 3) {
                pfVar7 = Mat::operator[]((Mat *)(in_RDI + 0xc0),0);
                fVar1 = *pfVar7;
                in_stack_ffffffffffffedd0 =
                     (allocator_type *)Mat::operator[]((Mat *)(in_RDI + 0xc0),1);
                if (local_1064 < fVar1) {
                  local_1064 = fVar1;
                }
                if (*(float *)in_stack_ffffffffffffedd0 < local_1064) {
                  local_1064 = *(float *)in_stack_ffffffffffffedd0;
                }
              }
              else if (*(int *)(in_RDI + 0xbc) == 4) {
                dVar8 = std::exp((double)((ulong)(uint)local_1064 ^ 0x8000000080000000));
                in_stack_ffffffffffffedcc = SUB84(dVar8,0);
                local_1064 = 1.0 / (in_stack_ffffffffffffedcc + 1.0);
              }
              local_1018[local_1060] = local_1064;
            }
            local_1018 = local_1018 + local_c3c;
          }
        }
        local_4 = 0;
        local_b3c = 1;
      }
    }
    else if ((*(byte *)(in_RDI + 0x1c9) & 1) == 1) {
      Mat::Mat(&local_cc8);
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                  (int)((ulong)in_stack_ffffffffffffedd8 >> 0x20),(int)in_stack_ffffffffffffedd8,
                  (int)((ulong)in_stack_ffffffffffffedd0 >> 0x20),
                  CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                  (Allocator *)in_stack_ffffffffffffedc0);
      bVar2 = Mat::empty(in_stack_ffffffffffffedc0);
      if (bVar2) {
        local_4 = -100;
        local_b3c = 1;
      }
      else {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                    (int)((ulong)in_stack_ffffffffffffedd8 >> 0x20),(int)in_stack_ffffffffffffedd8,
                    (int)((ulong)in_stack_ffffffffffffedd0 >> 0x20),
                    CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                    (Allocator *)in_stack_ffffffffffffedc0);
        bVar2 = Mat::empty(in_stack_ffffffffffffedc0);
        if (bVar2) {
          local_4 = -100;
          local_b3c = 1;
        }
        else {
          for (local_ccc = 0; local_ccc < *(int *)(in_RDI + 0x80); local_ccc = local_ccc + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                         (int)((ulong)in_stack_ffffffffffffedc0 >> 0x20));
            piVar4 = Mat::operator_cast_to_int_(&local_d18);
            Mat::~Mat((Mat *)0x14a8d8);
            local_cd8 = piVar4;
            for (local_d1c = 0; local_d1c < local_c40; local_d1c = local_d1c + 1) {
              for (local_d20 = 0; local_d20 < local_c3c; local_d20 = local_d20 + 1) {
                local_d24 = 0;
                local_d30 = Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0x100));
                local_d30 = local_d30 + local_c44 * local_aa4 * local_ccc;
                for (local_d34 = 0; local_d34 < local_aa4; local_d34 = local_d34 + 1) {
                  Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                               (int)((ulong)in_stack_ffffffffffffedc0 >> 0x20));
                  local_d80 = Mat::row<signed_char>(&local_d78,local_d1c * *(int *)(in_RDI + 0x98));
                  local_d80 = local_d80 + local_d20 * *(int *)(in_RDI + 0x94);
                  for (local_d84 = 0; local_d84 < local_c44; local_d84 = local_d84 + 1) {
                    local_d88 = (int)local_d80[local_c70[local_d84]];
                    local_d8c = (int)local_d30[local_d84];
                    local_d24 = local_d88 * local_d8c + local_d24;
                  }
                  local_d30 = local_d30 + local_c44;
                  Mat::~Mat((Mat *)0x14ab1e);
                }
                local_cd8[local_d20] = local_d24;
              }
              local_cd8 = local_cd8 + local_c3c;
            }
            local_d98 = in_RCX[4];
            local_da8 = in_RCX[2];
            uStack_da0 = in_RCX[3];
            _local_db8 = CONCAT44(1,(int)*in_RCX);
            uStack_db0 = *(undefined8 *)(in_RDX + 0x20);
            Mat::channel_range(in_stack_ffffffffffffedd8,
                               (int)((ulong)in_stack_ffffffffffffedd0 >> 0x20),
                               (int)in_stack_ffffffffffffedd0);
            Mat::channel_range(in_stack_ffffffffffffedd8,
                               (int)((ulong)in_stack_ffffffffffffedd0 >> 0x20),
                               (int)in_stack_ffffffffffffedd0);
            ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 0x1f0),(long)local_ccc);
            (*(*ppLVar5)->_vptr_Layer[7])(*ppLVar5,local_df8,local_e38,&local_db8);
            Mat::~Mat((Mat *)0x14ac7a);
            Mat::~Mat((Mat *)0x14ac87);
            if (*(int *)(in_RDI + 0xbc) == 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                           (int)((ulong)in_stack_ffffffffffffedc0 >> 0x20));
              pcVar6 = Mat::operator_cast_to_signed_char_(&local_e80);
              Mat::~Mat((Mat *)0x14acde);
              for (local_e84 = 0; local_e40 = pcVar6, local_e84 < local_c40 * local_c3c;
                  local_e84 = local_e84 + 1) {
                if (pcVar6[local_e84] < '\0') {
                  pcVar6[local_e84] = '\0';
                }
              }
            }
          }
          local_b3c = 0;
        }
      }
      Mat::~Mat((Mat *)0x14ae00);
      if (local_b3c == 0) {
LAB_0014b3d5:
        local_4 = 0;
        local_b3c = 1;
      }
    }
    else {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),_w,
                  (int)in_stack_ffffffffffffedd8,_c,
                  CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                  (Allocator *)in_stack_ffffffffffffedc0);
      bVar2 = Mat::empty(in_stack_ffffffffffffedc0);
      if (!bVar2) {
        for (local_e88 = 0; local_e88 < *(int *)(in_RDI + 0x80); local_e88 = local_e88 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                       (int)((ulong)in_stack_ffffffffffffedc0 >> 0x20));
          piVar4 = Mat::operator_cast_to_int_(&local_ed0);
          Mat::~Mat((Mat *)0x14af0b);
          local_e90 = piVar4;
          for (local_ed4 = 0; local_ed4 < local_c40; local_ed4 = local_ed4 + 1) {
            for (local_ed8 = 0; local_ed8 < local_c3c; local_ed8 = local_ed8 + 1) {
              local_edc = 0;
              local_ee8 = Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0x100));
              local_ee8 = local_ee8 + local_c44 * local_aa4 * local_e88;
              for (local_eec = 0; local_eec < local_aa4; local_eec = local_eec + 1) {
                Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                             (int)((ulong)in_stack_ffffffffffffedc0 >> 0x20));
                local_f38 = Mat::row<signed_char>(&local_f30,local_ed4 * *(int *)(in_RDI + 0x98));
                local_f38 = local_f38 + local_ed8 * *(int *)(in_RDI + 0x94);
                for (local_f3c = 0; local_f3c < local_c44; local_f3c = local_f3c + 1) {
                  local_f40 = (int)local_f38[local_c70[local_f3c]];
                  local_f44 = (int)local_ee8[local_f3c];
                  local_edc = local_f40 * local_f44 + local_edc;
                }
                local_ee8 = local_ee8 + local_c44;
                Mat::~Mat((Mat *)0x14b14b);
              }
              local_e90[local_ed8] = local_edc;
            }
            local_e90 = local_e90 + local_c3c;
          }
          local_f58 = in_RCX[4];
          local_f68 = in_RCX[2];
          uStack_f60 = in_RCX[3];
          _local_f78 = CONCAT44(1,(int)*in_RCX);
          uStack_f70 = *(undefined8 *)(in_RDX + 0x20);
          Mat::channel_range(in_stack_ffffffffffffedd8,
                             (int)((ulong)in_stack_ffffffffffffedd0 >> 0x20),
                             (int)in_stack_ffffffffffffedd0);
          ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x1d8),(long)local_e88);
          (*(*ppLVar5)->_vptr_Layer[9])(*ppLVar5,local_fb8,&local_f78);
          Mat::~Mat((Mat *)0x14b27c);
          if (*(int *)(in_RDI + 0xbc) == 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                         (int)((ulong)in_stack_ffffffffffffedc0 >> 0x20));
            pfVar7 = Mat::operator_cast_to_float_(&local_1000);
            Mat::~Mat((Mat *)0x14b2d0);
            local_fc0 = pfVar7;
            for (local_1004 = 0; local_1004 < local_c40 * local_c3c; local_1004 = local_1004 + 1) {
              local_1008 = 0.0;
              pfVar7 = std::max<float>(local_fc0 + local_1004,&local_1008);
              local_fc0[local_1004] = *pfVar7;
            }
          }
        }
        goto LAB_0014b3d5;
      }
      local_4 = -100;
      local_b3c = 1;
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffedd0);
  }
  Mat::~Mat((Mat *)0x14ba40);
LAB_0014ba51:
  Mat::~Mat((Mat *)0x14ba5e);
  return local_4;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    if (use_int8_inference)
    {
        if (use_int8_requantize == true)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100; 

            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                int* outptr = top_blob_tm.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                        // channels
                        for (int q=0; q<channels; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                int val = sptr[ space_ofs[k] ];
                                int w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // requantize, reverse scale inplace
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    requantize_ops[p]->forward(top_blob_tm_g, top_blob_g, opt_g);
                }       

                // activation relu
                if (activation_type == 1)
                {
                    signed char* outptr_s8 = top_blob.channel(p);

                    for (int i = 0; i < outh*outw; i++)
                    {
                        if (outptr_s8[i] < 0)
                            outptr_s8[i] = 0;
                    }
                }                                 
            }
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
      
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                int* outptr = top_blob.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                        // channels
                        for (int q=0; q<channels; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                int val = sptr[ space_ofs[k] ];
                                int w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // dequantize, reverse scale inplace
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    dequantize_ops[p]->forward_inplace(top_blob_g, opt_g);
                }

                // activation relu
                if (activation_type == 1)
                {
                    float* outptr_fp32 = top_blob.channel(p);

                    for (int i = 0; i < outh*outw; i++)
                    {
                        outptr_fp32[i] = std::max(outptr_fp32[i], 0.f);
                    }
                }
            }   
        }        

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                if (activation_type == 1)
                {
                    sum = std::max(sum, 0.f);
                }
                else if (activation_type == 2)
                {
                    float slope = activation_params[0];
                    sum = sum > 0.f ? sum : sum * slope;
                }
                else if (activation_type == 3)
                {
                    float min = activation_params[0];
                    float max = activation_params[1];
                    if (sum < min)
                        sum = min;
                    if (sum > max)
                        sum = max;
                }
                else if (activation_type == 4)
                {
                    sum = 1.f / (1.f + exp(-sum));
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}